

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

BrotliDecoderState *
BrotliDecoderCreateInstance(brotli_alloc_func alloc_func,brotli_free_func free_func,void *opaque)

{
  int iVar1;
  BrotliDecoderStateInternal *local_30;
  BrotliDecoderStateInternal *state;
  void *opaque_local;
  brotli_free_func free_func_local;
  brotli_alloc_func alloc_func_local;
  
  local_30 = (BrotliDecoderStateInternal *)0x0;
  if ((alloc_func == (brotli_alloc_func)0x0) && (free_func == (brotli_free_func)0x0)) {
    local_30 = (BrotliDecoderStateInternal *)malloc(0x1420);
  }
  else if ((alloc_func != (brotli_alloc_func)0x0) && (free_func != (brotli_free_func)0x0)) {
    local_30 = (BrotliDecoderStateInternal *)(*alloc_func)(opaque,0x1420);
  }
  if (local_30 == (BrotliDecoderStateInternal *)0x0) {
    alloc_func_local = (brotli_alloc_func)0x0;
  }
  else {
    iVar1 = BrotliDecoderStateInit(local_30,alloc_func,free_func,opaque);
    if (iVar1 == 0) {
      if ((alloc_func == (brotli_alloc_func)0x0) && (free_func == (brotli_free_func)0x0)) {
        free(local_30);
      }
      else if ((alloc_func != (brotli_alloc_func)0x0) && (free_func != (brotli_free_func)0x0)) {
        (*free_func)(opaque,local_30);
      }
      alloc_func_local = (brotli_alloc_func)0x0;
    }
    else {
      alloc_func_local = (brotli_alloc_func)local_30;
    }
  }
  return (BrotliDecoderState *)alloc_func_local;
}

Assistant:

BrotliDecoderState* BrotliDecoderCreateInstance(
    brotli_alloc_func alloc_func, brotli_free_func free_func, void* opaque) {
  BrotliDecoderState* state = 0;
  if (!alloc_func && !free_func) {
    state = (BrotliDecoderState*)malloc(sizeof(BrotliDecoderState));
  } else if (alloc_func && free_func) {
    state = (BrotliDecoderState*)alloc_func(opaque, sizeof(BrotliDecoderState));
  }
  if (state == 0) {
    BROTLI_DUMP();
    return 0;
  }
  if (!BrotliDecoderStateInit(state, alloc_func, free_func, opaque)) {
    BROTLI_DUMP();
    if (!alloc_func && !free_func) {
      free(state);
    } else if (alloc_func && free_func) {
      free_func(opaque, state);
    }
    return 0;
  }
  return state;
}